

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

uint64_t __thiscall jessilib::text_hash::hash<char>(text_hash *this,char *data,char *end)

{
  ulong uVar1;
  decode_result dVar2;
  
  uVar1 = 0xcbf29ce484222325;
  while( true ) {
    if (this == (text_hash *)data) {
      return uVar1;
    }
    dVar2 = decode_codepoint<char>((jessilib *)this,data,end);
    end = (char *)dVar2.units;
    if (end == (char *)0x0) break;
    uVar1 = (uVar1 ^ (uint)dVar2.codepoint) * 0x100000001b3;
    this = (text_hash *)((jessilib *)this + (long)end);
  }
  return uVar1;
}

Assistant:

static uint64_t hash(const CharT* data, const CharT* end) {
		uint64_t hash = 14695981039346656037ULL;

		decode_result decode;
		while (data != end) {
			decode = decode_codepoint(data, end);
			if (decode.units == 0) {
				return hash;
			}

			hash = hash ^ decode.codepoint;
			hash = hash * 1099511628211ULL;
			data += decode.units;
		}

		return hash;
	}